

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::exceptions::option_already_exists::~option_already_exists(option_already_exists *this)

{
  option_already_exists *this_local;
  
  ~option_already_exists(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit option_already_exists(const std::string& option)
  : specification("Option " + LQUOTE + option + RQUOTE + " already exists")
  {
  }